

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GroupEncryptFileFilter.cpp
# Opt level: O2

void __thiscall
GroupEncryptFileFilter::doFilter(GroupEncryptFileFilter *this,ifstream *in,ofstream *out)

{
  int iVar1;
  char inChar;
  
  this->charCounter = 0;
  do {
    while( true ) {
      while( true ) {
        iVar1 = std::istream::peek();
        if (iVar1 == -1) {
          return;
        }
        if (this->charCounter < 5) break;
        std::ostream::put((char)out);
        this->charCounter = 0;
      }
      iVar1 = std::istream::peek();
      if (iVar1 != 0x20) break;
LAB_001023b0:
      std::istream::get((char *)in);
    }
    iVar1 = std::istream::peek();
    if (iVar1 == 10) goto LAB_001023b0;
    std::istream::get((char *)in);
    (*(this->super_FileFilter)._vptr_FileFilter[1])(this,(ulong)(uint)(int)inChar);
    std::ostream::put((char)out);
    this->charCounter = this->charCounter + 1;
  } while( true );
}

Assistant:

void GroupEncryptFileFilter::doFilter(std::ifstream &in, std::ofstream &out)
{
    this->charCounter = 0;

    while((in.peek() != EOF))
    {

        char inChar;
        char outChar;

        if(this->charCounter >= 5)
        {
            out.put(' ');
            this->charCounter = 0;
            continue;
        }
        else if(in.peek() == ' ' || in.peek() == '\n')
        {
            //grab the input and throw it away
            in.get(inChar);
            continue;
        }
        else
        {
            in.get(inChar);
            outChar = transform(inChar);
            out.put(outChar);
            this->charCounter++;
        }
    }
}